

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

void reportError(string *message,Node *node)

{
  ostream *poVar1;
  runtime_error *this;
  Mark mark;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  mark = node->mark_;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_190,"ERROR (");
  Mark::to_string_abi_cxx11_(&local_1c0,&mark);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"): ");
  std::operator<<(poVar1,(string *)message);
  std::__cxx11::string::~string((string *)&local_1c0);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)&local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]]
void reportError(const std::string& message, const Node& node)
{
  const auto mark = node.getMark();
  std::stringstream ss;
  ss << "ERROR (" << mark.to_string() << "): " << message;
  throw std::runtime_error(ss.str());
}